

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maxcover.cpp
# Opt level: O3

bool get_max_cover_static1<512ul>
               (vector<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::allocator<std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>
                *sets,unordered_map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_unsigned_long>_>_>
                      *names,vector<unsigned_long,_std::allocator<unsigned_long>_> *_begin,
               vector<unsigned_long,_std::allocator<unsigned_long>_> *_end,size_t k,
               bool print_progress)

{
  ostream *poVar1;
  
  if (k - 1 < 10) {
    (*(code *)(&PTR_get_max_cover_static2<448ul,10>_001b8c88)[k])();
  }
  else {
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cerr,"size of the collection is too big: ",0x23);
    poVar1 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cerr);
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar1 + -0x18) + (char)poVar1);
    std::ostream::put((char)poVar1);
    std::ostream::flush();
  }
  return k - 1 < 10;
}

Assistant:

bool get_max_cover_static1(const std::vector<Set>& sets, const std::unordered_map<std::string, size_t>& names,
    const std::vector<size_t>& _begin, const std::vector<size_t>& _end, size_t k, bool print_progress = false)
{
    auto fn = get_max_cover_static2<n, 1>;

         if (k == 1) fn = get_max_cover_static2<n, 1>;
    else if (k == 2) fn = get_max_cover_static2<n, 2>;
    else if (k == 3) fn = get_max_cover_static2<n, 3>;
    else if (k == 4) fn = get_max_cover_static2<n, 4>;
    else if (k == 5) fn = get_max_cover_static2<n, 5>;
    else if (k == 6) fn = get_max_cover_static2<n, 6>;
    else if (k == 7) fn = get_max_cover_static2<n, 7>;
    else if (k == 8) fn = get_max_cover_static2<n, 8>;
    else if (k == 9) fn = get_max_cover_static2<n, 9>;
    else if (k == 10) fn = get_max_cover_static2<n, 10>;
    else
    {
        std::cerr << "size of the collection is too big: " << k << std::endl;
        return false;
    }
    
    fn(sets, names, _begin, _end, print_progress);

    return true;
}